

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lexer.cpp
# Opt level: O0

char * lex_token(LexerContext *lexer,char *begin,char *end,size_t begin_pos)

{
  size_t sVar1;
  bool bVar2;
  char *pcVar3;
  difference_type dVar4;
  pair<const_char_*,_unsigned_long> *ppVar5;
  size_t length;
  bool local_c1;
  char *it;
  char *local_a0;
  pair<const_char_*,_unsigned_long> token;
  optional<std::pair<const_char_*,_size_t>_> local_80;
  undefined1 local_68 [8];
  pair<const_char_*,_unsigned_long> token_1;
  char *it_1;
  anon_class_8_1_6f04b27d aStack_40;
  anon_class_1_0_00000001 is_float;
  anon_class_8_1_6f04b27d is_integer;
  size_t sStack_30;
  anon_class_1_0_00000001 have_hexadecimal_prefix;
  size_t begin_pos_local;
  char *end_local;
  char *begin_local;
  LexerContext *lexer_local;
  
  sStack_30 = begin_pos;
  end_local = begin;
  while( true ) {
    local_c1 = false;
    if (end_local != end) {
      local_c1 = lex_iswhite((int)*end_local);
    }
    if (local_c1 == false) break;
    end_local = end_local + 1;
    sStack_30 = sStack_30 + 1;
  }
  lexer_local = (LexerContext *)end;
  if (end_local != end) {
    aStack_40.have_hexadecimal_prefix =
         (anon_class_1_0_00000001 *)((long)&is_integer.have_hexadecimal_prefix + 7);
    if (*end_local == '\"') {
      pcVar3 = std::next<char_const*>(end_local,1);
      token_1.second._7_1_ = 0x22;
      pcVar3 = std::find<char_const*,char>(pcVar3,end,(char *)((long)&token_1.second + 7));
      sVar1 = sStack_30;
      if (pcVar3 == end) {
        LexerContext::error<char_const(&)[34]>
                  (lexer,sStack_30,(char (*) [34])"missing terminating \'\"\' character");
      }
      else {
        dVar4 = std::distance<char_const*>(end_local,pcVar3);
        LexerContext::add_token(lexer,String,sVar1,dVar4 + 1);
        lexer_local = (LexerContext *)std::next<char_const*>(pcVar3,1);
      }
    }
    else {
      if (((('/' < *end_local) && (*end_local < ':')) || (*end_local == '-')) || (*end_local == '.')
         ) {
        lex_gettok(&local_80,end_local,end);
        ppVar5 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::value
                           (&local_80);
        local_68 = (undefined1  [8])ppVar5->first;
        token_1.first = (char *)ppVar5->second;
        bVar2 = lex_token::anon_class_8_1_6f04b27d::operator()
                          (&stack0xffffffffffffffc0,(pair<const_char_*,_unsigned_long> *)local_68);
        if (bVar2) {
          if ((((lexer->program->opt).pedantic & 1U) != 0) &&
             (bVar2 = lex_token::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)
                                 ((long)&is_integer.have_hexadecimal_prefix + 7),
                                 (pair<const_char_*,_unsigned_long> *)local_68), bVar2)) {
            std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                      ((pair<unsigned_long,_unsigned_long> *)&token.second,&stack0xffffffffffffffd0,
                       (unsigned_long *)&token_1);
            LexerContext::pedantic<char_const(&)[66]>
                      (lexer,stack0xffffffffffffff70,
                       (char (*) [66])
                       "hexadecimal integer literals are a language extension [-pedantic]");
          }
          LexerContext::add_token(lexer,Integer,sStack_30,(size_t)token_1.first);
          return (char *)((long)local_68 + (long)token_1.first);
        }
        bVar2 = lex_token::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&it_1 + 7),
                           (pair<const_char_*,_unsigned_long> *)local_68);
        if (bVar2) {
          LexerContext::add_token(lexer,Float,sStack_30,(size_t)token_1.first);
          return (char *)((long)local_68 + (long)token_1.first);
        }
      }
      lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)&it,end_local,end);
      ppVar5 = std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::value
                         ((optional<std::pair<const_char_*,_unsigned_long>_> *)&it);
      sVar1 = sStack_30;
      local_a0 = ppVar5->first;
      token.first = (char *)ppVar5->second;
      lexer_local = (LexerContext *)(token.first + (long)local_a0);
      length = std::distance<char_const*>(end_local,(char *)lexer_local);
      LexerContext::add_token(lexer,Text,sVar1,length);
    }
  }
  return (char *)lexer_local;
}

Assistant:

static auto lex_token(LexerContext& lexer, const char* begin, const char* end, size_t begin_pos) -> const char*
{
    while(begin != end && lex_iswhite(*begin))
        ++begin, ++begin_pos;

    if(begin == end)
        return end;

    auto have_hexadecimal_prefix = [](const std::pair<const char*, size_t>& token)
    {
        return (token.second > 2 && token.first[0] == '0' && (token.first[1] == 'x' || token.first[1] == 'X'));
    };

    auto is_integer = [&have_hexadecimal_prefix](const std::pair<const char*, size_t>& token)
    {
        bool is_hexa = have_hexadecimal_prefix(token);

        for(size_t i = (is_hexa? 2 : 0); i < token.second; ++i)
        {
            if(token.first[i] < '0' || token.first[i] > '9')
            {
                if(is_hexa && ((token.first[i] >= 'A' && token.first[i] <= 'F')
                    || (token.first[i] >= 'a' && token.first[i] <= 'f')))
                {
                    continue;
                }
                else if(token.first[i] == '-')
                {
                    // valid even if i != 0
                    continue;
                }
                return false;
            }
        }
        return true;
    };

    auto is_float = [](const std::pair<const char*, size_t>& token)
    {
        for(size_t i = 0; i < token.second; ++i)
        {
            if(token.first[i] < '0' || token.first[i] > '9')
            {
                if(token.first[i] == '.' || (token.first[i] == '-' && i == 0))
                    continue;

                if(token.first[i] == 'f' || token.first[i] == 'F')
                {
                    // valid even if not in the end of the token
                    continue;
                }

                return false;
            }
        }
        return true;
    };

    if(*begin == '"')
    {
        auto it = std::find(std::next(begin), end, '"');
        if(it == end)
        {
            lexer.error(begin_pos, "missing terminating '\"' character");
            return end;
        }
        lexer.add_token(Token::String, begin_pos, std::distance(begin, it) + 1);
        return std::next(it);
    }

    if((*begin >= '0' && *begin <= '9') || *begin == '-' || *begin == '.')
    {
        auto token = lex_gettok(begin, end).value();

        if(is_integer(token))
        {
            if(lexer.program.opt.pedantic && have_hexadecimal_prefix(token))
                lexer.pedantic({begin_pos, token.second}, "hexadecimal integer literals are a language extension [-pedantic]");

            lexer.add_token(Token::Integer, begin_pos, token.second);
            return token.first + token.second;
        }
        else if(is_float(token))
        {
            lexer.add_token(Token::Float, begin_pos, token.second);
            return token.first + token.second;
        }
    }

    auto token = lex_gettok(begin, end).value();
    auto it = token.first + token.second;
    lexer.add_token(Token::Text, begin_pos, std::distance(begin, it));
    return it;
}